

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,char *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  char local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  char *local_a8;
  char local_a0 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_80;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  size_type local_20;
  pointer local_18;
  undefined8 local_10;
  
  local_80.first._M_str = (a->_M_dataplus)._M_p;
  local_80.first._M_len = a->_M_string_length;
  local_80.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a0[0] = *b;
  local_a8 = local_a0;
  local_b8 = 0;
  local_b0 = 1;
  local_68 = 1;
  local_58 = 0;
  local_48 = (args->_M_dataplus)._M_p;
  local_50 = args->_M_string_length;
  local_40 = 0;
  local_d8[0] = *args_1;
  local_30 = local_d8;
  local_38 = 1;
  local_28 = 0;
  local_18 = (args_2->_M_dataplus)._M_p;
  local_20 = args_2->_M_string_length;
  local_10 = 0;
  views._M_len = 5;
  views._M_array = &local_80;
  local_60 = local_a8;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}